

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_half_to_float_4chan_planar(exr_decode_pipeline_t *decode)

{
  int w;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  exr_coding_channel_info_t *peVar5;
  long lVar6;
  int iVar7;
  uint16_t *in;
  float *out;
  float *out_00;
  float *out_01;
  float *out_02;
  
  iVar7 = (decode->chunk).height;
  if (0 < iVar7) {
    peVar5 = decode->channels;
    w = peVar5->width;
    lVar6 = (long)w;
    out_01 = (float *)peVar5[3].field_12.decode_to_ptr;
    out_02 = (float *)peVar5[2].field_12.decode_to_ptr;
    out = (float *)(peVar5->field_12).decode_to_ptr;
    out_00 = (float *)peVar5[1].field_12.decode_to_ptr;
    iVar1 = peVar5[3].user_line_stride;
    iVar2 = peVar5[2].user_line_stride;
    iVar3 = peVar5[1].user_line_stride;
    iVar4 = peVar5->user_line_stride;
    in = (uint16_t *)decode->unpacked_buffer;
    do {
      half_to_float_buffer(out,in,w);
      half_to_float_buffer(out_00,in + lVar6,w);
      half_to_float_buffer(out_02,in + lVar6 * 2,w);
      half_to_float_buffer(out_01,in + lVar6 * 3,w);
      out = (float *)((long)out + (long)iVar4);
      out_00 = (float *)((long)out_00 + (long)iVar3);
      out_02 = (float *)((long)out_02 + (long)iVar2);
      out_01 = (float *)((long)out_01 + (long)iVar1);
      iVar7 = iVar7 + -1;
      in = (uint16_t *)((long)(w * 8) + (long)in);
    } while (iVar7 != 0);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_4chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    // planar output
    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion

        half_to_float_buffer ((float*) out0, in0, w);
        half_to_float_buffer ((float*) out1, in1, w);
        half_to_float_buffer ((float*) out2, in2, w);
        half_to_float_buffer ((float*) out3, in3, w);

        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}